

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O3

void Diligent::ValidateMapTextureParams
               (TextureDesc *TexDesc,Uint32 MipLevel,Uint32 ArraySlice,MAP_TYPE MapType,
               Uint32 MapFlags,Box *pMapRegion)

{
  char *pcVar1;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  uint local_3c;
  char *local_38;
  
  ArraySlice_local = ArraySlice;
  MipLevel_local = MipLevel;
  if (TexDesc->MipLevels <= MipLevel) {
    pcVar1 = (TexDesc->super_DeviceObjectAttribs).Name;
    local_38 = "";
    if (pcVar1 != (char *)0x0) {
      local_38 = pcVar1;
    }
    local_3c = TexDesc->MipLevels - 1;
    LogError<false,char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[3]>
              (false,"ValidateMapTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1d3,(char (*) [10])0x35c58b,&local_38,(char (*) [4])"\': ",
               (char (*) [12])"Mip level (",&MipLevel_local,
               (char (*) [31])") is out of allowed range [0, ",&local_3c,(char (*) [3])0x3326d9);
  }
  if ((TexDesc->Type < 9) && ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
    if ((TexDesc->field_3).ArraySize <= ArraySlice) {
      pcVar1 = (TexDesc->super_DeviceObjectAttribs).Name;
      local_38 = "";
      if (pcVar1 != (char *)0x0) {
        local_38 = pcVar1;
      }
      local_3c = (TexDesc->field_3).ArraySize - 1;
      LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[22],unsigned_int,char[3]>
                (false,"ValidateMapTextureParams",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1d6,(char (*) [10])0x35c58b,&local_38,(char (*) [4])"\': ",
                 (char (*) [14])"Array slice (",&ArraySlice_local,
                 (char (*) [22])") is out of range [0,",&local_3c,(char (*) [3])0x3326d9);
    }
  }
  else if (ArraySlice != 0) {
    pcVar1 = (TexDesc->super_DeviceObjectAttribs).Name;
    local_38 = "";
    if (pcVar1 != (char *)0x0) {
      local_38 = pcVar1;
    }
    LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[36]>
              (false,"ValidateMapTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1da,(char (*) [10])0x35c58b,&local_38,(char (*) [4])"\': ",
               (char (*) [14])"Array slice (",&ArraySlice_local,
               (char (*) [36])") must be 0 for non-array textures.");
  }
  if (pMapRegion != (Box *)0x0) {
    ValidateTextureRegion(TexDesc,MipLevel_local,ArraySlice_local,pMapRegion);
  }
  return;
}

Assistant:

void ValidateMapTextureParams(const TextureDesc& TexDesc,
                              Uint32             MipLevel,
                              Uint32             ArraySlice,
                              MAP_TYPE           MapType,
                              Uint32             MapFlags,
                              const Box*         pMapRegion)
{
    VERIFY_TEX_PARAMS(MipLevel < TexDesc.MipLevels, "Mip level (", MipLevel, ") is out of allowed range [0, ", TexDesc.MipLevels - 1, "].");
    if (TexDesc.IsArray())
    {
        VERIFY_TEX_PARAMS(ArraySlice < TexDesc.ArraySize, "Array slice (", ArraySlice, ") is out of range [0,", TexDesc.ArraySize - 1, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(ArraySlice == 0, "Array slice (", ArraySlice, ") must be 0 for non-array textures.");
    }

    if (pMapRegion != nullptr)
    {
        ValidateTextureRegion(TexDesc, MipLevel, ArraySlice, *pMapRegion);
    }
}